

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_set_sr(DisasContext_conflict2 *s,TCGv_i32 val,int ccr_only)

{
  TCGContext_conflict2 *tcg_ctx;
  uintptr_t o;
  TCGTemp *local_18;
  TCGv_i32 local_10;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (ccr_only == 0) {
    gen_helper_set_sr(tcg_ctx,tcg_ctx->cpu_env,val);
  }
  else {
    local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_10 = val + (long)tcg_ctx;
    tcg_gen_callN_m68k(tcg_ctx,helper_set_ccr_m68k,(TCGTemp *)0x0,2,&local_18);
  }
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static void gen_set_sr(DisasContext *s, TCGv val, int ccr_only)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (ccr_only) {
        gen_helper_set_ccr(tcg_ctx, tcg_ctx->cpu_env, val);
    } else {
        gen_helper_set_sr(tcg_ctx, tcg_ctx->cpu_env, val);
    }
    set_cc_op(s, CC_OP_FLAGS);
}